

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O3

int p_count(parse *p)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  ushort **ppuVar5;
  long lVar6;
  
  pcVar2 = p->next;
  pcVar3 = p->end;
  iVar4 = 0;
  if (pcVar2 < pcVar3) {
    lVar6 = 0;
    ppuVar5 = __ctype_b_loc();
    iVar4 = 0;
    do {
      if (((*(byte *)((long)*ppuVar5 + (long)pcVar2[lVar6] * 2 + 1) & 8) == 0) || (0xff < iVar4))
      goto LAB_001054b5;
      pcVar1 = pcVar2 + lVar6;
      p->next = pcVar1 + 1;
      iVar4 = (int)*pcVar1 + iVar4 * 10 + -0x30;
      lVar6 = lVar6 + 1;
    } while (pcVar1 + 1 != pcVar3);
    lVar6 = 1;
LAB_001054b5:
    if (((int)lVar6 != 0) && (iVar4 < 0x100)) {
      return iVar4;
    }
  }
  if (p->error == 0) {
    p->error = 10;
  }
  p->next = nuls;
  p->end = nuls;
  return iVar4;
}

Assistant:

static int			/* the value */
p_count(p)
struct parse *p;
{
	int count = 0;
	int ndigits = 0;

	while (MORE() && isdigit(PEEK()) && count <= DUPMAX) {
		count = count*10 + (GETNEXT() - '0');
		ndigits++;
	}

	REQUIRE(ndigits > 0 && count <= DUPMAX, REG_BADBR);
	return(count);
}